

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int ed_getvariant(disisa *isa,char *name)

{
  int iVar1;
  disvariant *pdVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = isa->varsnum;
  if (0 < (long)iVar1) {
    pdVar2 = isa->vars;
    lVar4 = 0;
    do {
      iVar3 = strcmp(name,*(char **)((long)&pdVar2->name + lVar4));
      if (iVar3 == 0) {
        return *(int *)((long)&pdVar2->vartype + lVar4);
      }
      lVar4 = lVar4 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar4);
  }
  return 0;
}

Assistant:

int ed_getvariant(const struct disisa *isa, const char *name) {
	int i;
	for (i = 0; i < isa->varsnum; i++)
		if (!strcmp(name, isa->vars[i].name))
			return isa->vars[i].vartype;
	return 0;
}